

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TrackEventConfig::TrackEventConfig
          (TrackEventConfig *this,TrackEventConfig *param_1)

{
  undefined7 uVar1;
  bool bVar2;
  TrackEventConfig *param_1_local;
  TrackEventConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TrackEventConfig_009c1650;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->disabled_categories_,&param_1->disabled_categories_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->enabled_categories_,&param_1->enabled_categories_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->disabled_tags_,&param_1->disabled_tags_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->enabled_tags_,&param_1->enabled_tags_);
  uVar1 = *(undefined7 *)&param_1->field_0x69;
  this->disable_incremental_timestamps_ = param_1->disable_incremental_timestamps_;
  *(undefined7 *)&this->field_0x69 = uVar1;
  this->timestamp_unit_multiplier_ = param_1->timestamp_unit_multiplier_;
  bVar2 = param_1->enable_thread_time_sampling_;
  this->filter_debug_annotations_ = param_1->filter_debug_annotations_;
  this->enable_thread_time_sampling_ = bVar2;
  this->filter_dynamic_event_names_ = param_1->filter_dynamic_event_names_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TrackEventConfig::TrackEventConfig(TrackEventConfig&&) noexcept = default;